

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NewSymbolTreeVisitor.cpp
# Opt level: O2

void __thiscall
NewSymbolTreeVisitor::Visit(NewSymbolTreeVisitor *this,VariableDeclaration *variable_declaration)

{
  string *__lhs;
  NewScopeLayer *pNVar1;
  Type *pTVar2;
  pointer pcVar3;
  size_type sVar4;
  bool bVar5;
  mapped_type *pmVar6;
  runtime_error *this_00;
  string *psVar7;
  string new_type_name;
  string local_b0;
  Symbol local_90;
  string local_70;
  string local_50;
  
  pNVar1 = this->current_layer_;
  pTVar2 = variable_declaration->type_;
  psVar7 = &variable_declaration->variable_name_;
  std::__cxx11::string::string((string *)&local_50,(string *)psVar7);
  Symbol::Symbol((Symbol *)&new_type_name,&local_50);
  NewScopeLayer::DeclareVariable(pNVar1,pTVar2,(Symbol *)&new_type_name);
  std::__cxx11::string::~string((string *)&new_type_name);
  std::__cxx11::string::~string((string *)&local_50);
  pTVar2 = variable_declaration->type_;
  __lhs = &pTVar2->type_name_;
  bVar5 = std::operator==(__lhs,"void");
  if (!bVar5) {
    bVar5 = std::operator!=(__lhs,"int");
    if (bVar5) {
      bVar5 = std::operator!=(__lhs,"boolean");
      if (bVar5) {
        bVar5 = std::operator!=(__lhs,"int[]");
        if (bVar5) {
          bVar5 = std::operator!=(__lhs,"boolean[]");
          if (bVar5) {
            pcVar3 = (pTVar2->type_name_)._M_dataplus._M_p;
            sVar4 = (pTVar2->type_name_)._M_string_length;
            if (pcVar3[sVar4 - 1] == ']') {
              new_type_name._M_dataplus._M_p = (pointer)&new_type_name.field_2;
              std::__cxx11::string::
              _M_construct<__gnu_cxx::__normal_iterator<char_const*,std::__cxx11::string>>
                        ((string *)&new_type_name,pcVar3,pcVar3 + (sVar4 - 2));
              pNVar1 = this->current_layer_;
              std::__cxx11::string::string((string *)&local_b0,(string *)psVar7);
              Symbol::Symbol(&local_90,&local_b0);
              pmVar6 = std::__detail::
                       _Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&pNVar1->user_type_system_,&local_90);
              std::__cxx11::string::_M_assign((string *)pmVar6);
              std::__cxx11::string::~string((string *)&local_90);
              std::__cxx11::string::~string((string *)&local_b0);
              psVar7 = &new_type_name;
            }
            else {
              pNVar1 = this->current_layer_;
              std::__cxx11::string::string((string *)&local_70,(string *)psVar7);
              Symbol::Symbol((Symbol *)&new_type_name,&local_70);
              pmVar6 = std::__detail::
                       _Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                       ::operator[]((_Map_base<Symbol,_std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_Symbol,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>,_std::__detail::_Select1st,_std::equal_to<Symbol>,_std::hash<Symbol>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_false,_true>,_true>
                                     *)&pNVar1->user_type_system_,(key_type *)&new_type_name);
              std::__cxx11::string::_M_assign((string *)pmVar6);
              std::__cxx11::string::~string((string *)&new_type_name);
              psVar7 = &local_70;
            }
            std::__cxx11::string::~string((string *)psVar7);
          }
        }
      }
    }
    return;
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  std::runtime_error::runtime_error(this_00,"Can\'t declare variable of void type");
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

void NewSymbolTreeVisitor::Visit(VariableDeclaration* variable_declaration) {
  current_layer_->DeclareVariable(variable_declaration->type_,
                                  Symbol(variable_declaration->variable_name_));

  const std::string& type_name = variable_declaration->type_->type_name_;

  if (type_name == "void") {
    throw std::runtime_error("Can't declare variable of void type");
  }

  // pre type checking to resolve class methods and fields
  if (type_name != "int" && type_name != "boolean" && type_name != "int[]" &&
      type_name != "boolean[]") {
    if (type_name.back() != ']') {
      current_layer_
          ->user_type_system_[Symbol(variable_declaration->variable_name_)] =
          type_name;
    } else {
      std::string new_type_name(type_name.begin(), type_name.end() - 2);

      current_layer_
          ->user_type_system_[Symbol(variable_declaration->variable_name_)] =
          new_type_name;
    }
  }
}